

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::adoptDecimalQuantity(Formattable *this,DecimalQuantity *dq)

{
  bool bVar1;
  int64_t iVar2;
  double dVar3;
  
  if (this->fDecimalQuantity != (DecimalQuantity *)0x0) {
    (*(this->fDecimalQuantity->super_IFixedDecimal)._vptr_IFixedDecimal[1])();
  }
  this->fDecimalQuantity = dq;
  if (dq != (DecimalQuantity *)0x0) {
    bVar1 = icu_63::number::impl::DecimalQuantity::fitsInLong(dq,false);
    if (bVar1) {
      iVar2 = icu_63::number::impl::DecimalQuantity::toLong(this->fDecimalQuantity,false);
      (this->fValue).fInt64 = iVar2;
      if ((int)iVar2 == iVar2) {
        this->fType = kLong;
      }
      else {
        this->fType = kInt64;
      }
    }
    else {
      this->fType = kDouble;
      dVar3 = icu_63::number::impl::DecimalQuantity::toDouble(this->fDecimalQuantity);
      (this->fValue).fDouble = dVar3;
    }
  }
  return;
}

Assistant:

void
Formattable::adoptDecimalQuantity(DecimalQuantity *dq) {
    if (fDecimalQuantity != NULL) {
        delete fDecimalQuantity;
    }
    fDecimalQuantity = dq;
    if (dq == NULL) { // allow adoptDigitList(NULL) to clear
        return;
    }

    // Set the value into the Union of simple type values.
    // Cannot use the set() functions because they would delete the fDecimalNum value.
    if (fDecimalQuantity->fitsInLong()) {
        fValue.fInt64 = fDecimalQuantity->toLong();
        if (fValue.fInt64 <= INT32_MAX && fValue.fInt64 >= INT32_MIN) {
            fType = kLong;
        } else {
            fType = kInt64;
        }
    } else {
        fType = kDouble;
        fValue.fDouble = fDecimalQuantity->toDouble();
    }
}